

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_microprops.h
# Opt level: O2

void __thiscall
icu_63::number::impl::MicroProps::processQuantity
          (MicroProps *this,DecimalQuantity *param_1,MicroProps *micros,UErrorCode *status)

{
  if (this != micros) {
    operator=(micros,this);
    return;
  }
  micros->exhausted = true;
  return;
}

Assistant:

void processQuantity(DecimalQuantity&, MicroProps& micros, UErrorCode& status) const U_OVERRIDE {
        (void) status;
        if (this == &micros) {
            // Unsafe path: no need to perform a copy.
            U_ASSERT(!exhausted);
            micros.exhausted = true;
            U_ASSERT(exhausted);
        } else {
            // Safe path: copy self into the output micros.
            micros = *this;
        }
    }